

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::OnStartTriggersTimeout(TracingServiceImpl *this,TracingSessionID tsid)

{
  TracingSession *pTVar1;
  TracingSession *tracing_session_ptr;
  TracingSessionID tsid_local;
  TracingServiceImpl *this_local;
  
  tracing_session_ptr = (TracingSession *)tsid;
  tsid_local = (TracingSessionID)this;
  pTVar1 = GetTracingSession(this,tsid);
  if ((pTVar1 != (TracingSession *)0x0) && (pTVar1->state == CONFIGURED)) {
    perfetto::base::ignore_result<char[58],unsigned_long>
              ((char (*) [58])"Disabling TracingSession %lu since no triggers activated.",
               (unsigned_long *)&tracing_session_ptr);
    DisableTracing(this,(TracingSessionID)tracing_session_ptr,false);
  }
  return;
}

Assistant:

void TracingServiceImpl::OnStartTriggersTimeout(TracingSessionID tsid) {
  // Skip entirely the flush if the trace session doesn't exist anymore.
  // This is to prevent misleading error messages to be logged.
  //
  // if the trace has started from the trigger we rely on
  // the |stop_delay_ms| from the trigger so don't flush and
  // disable if we've moved beyond a CONFIGURED state
  auto* tracing_session_ptr = GetTracingSession(tsid);
  if (tracing_session_ptr &&
      tracing_session_ptr->state == TracingSession::CONFIGURED) {
    PERFETTO_DLOG("Disabling TracingSession %" PRIu64
                  " since no triggers activated.",
                  tsid);
    // No data should be returned from ReadBuffers() regardless of if we
    // call FreeBuffers() or DisableTracing(). This is because in
    // STOP_TRACING we need this promise in either case, and using
    // DisableTracing() allows a graceful shutdown. Consumers can follow
    // their normal path and check the buffers through ReadBuffers() and
    // the code won't hang because the tracing session will still be
    // alive just disabled.
    DisableTracing(tsid);
  }
}